

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

void __thiscall test_solvers_2x3::test_method(test_solvers_2x3 *this)

{
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> _Stack_78;
  matrix<int,_boost::numeric::ublas::basic_row_major<unsigned_long,_long>,_boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>_>
  local_60;
  size_t expected_assignment [2];
  int costs [6];
  
  costs[0] = 1;
  costs[1] = 2;
  costs[2] = 0;
  costs[3] = 1;
  costs[4] = 3;
  costs[5] = 0;
  expected_assignment[0] = 0;
  expected_assignment[1] = 2;
  make_matrix<int>(&local_60,costs,2,3);
  make_vector<unsigned_long>
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_78,expected_assignment
             ,2);
  assert_solvers_result<int>
            (&local_60,1,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&_Stack_78);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&_Stack_78);
  boost::numeric::ublas::unbounded_array<int,_std::allocator<int>_>::~unbounded_array
            (&local_60.data_);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(test_solvers_2x3)
{
  const int costs[] = {1, 2, 0,
                       1, 3, 0};
  const std::size_t expected_assignment[] = {0, 2};
  assert_solvers_result(make_matrix(costs, 2, 3), 1, make_vector(expected_assignment, 2));
}